

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uds_socket_ping_pong.c
# Opt level: O0

int main(int argc,char **argv)

{
  cio_error cVar1;
  cio_address_family cVar2;
  __sighandler_t p_Var3;
  undefined8 local_3e8;
  client client;
  cio_socket socket;
  cio_socket_address client_endpoint;
  cio_server_socket server_socket;
  char cStack_9d;
  cio_error err;
  char path [13];
  cio_socket_address endpoint;
  int ret;
  char **argv_local;
  int argc_local;
  
  if (argc == 2) {
    max_pings = strtoul(argv[1],(char **)0x0,10);
    if (max_pings == 0xffffffffffffffff) {
      usage(*argv);
      argv_local._4_4_ = 1;
    }
    else {
      p_Var3 = signal(0xf,sighandler);
      if (p_Var3 == (__sighandler_t)0xffffffffffffffff) {
        fprintf(_stderr,"could no install SIGTERM handler!\n");
        argv_local._4_4_ = -1;
      }
      else {
        p_Var3 = signal(2,sighandler);
        if (p_Var3 == (__sighandler_t)0xffffffffffffffff) {
          fprintf(_stderr,"could no install SIGINT handler!\n");
          signal(0xf,(__sighandler_t)0x0);
          argv_local._4_4_ = -1;
        }
        else {
          _cStack_9d = 0x6f662f706d742f00;
          builtin_strncpy(path,"obar",5);
          cVar1 = cio_init_uds_socket_address((cio_socket_address *)(path + 5),&cStack_9d);
          if (cVar1 == CIO_SUCCESS) {
            cVar1 = cio_eventloop_init(&loop);
            if (cVar1 == CIO_SUCCESS) {
              cVar2 = cio_socket_address_get_family((cio_socket_address *)(path + 5));
              cVar1 = cio_server_socket_init
                                ((cio_server_socket *)
                                 (client_endpoint.impl.sa.unix_address.un.sun_path + 0x66),&loop,5,
                                 cVar2,alloc_echo_client,free_echo_client,1000000000,
                                 (cio_server_socket_close_hook_t)0x0);
              if (cVar1 == CIO_SUCCESS) {
                cVar1 = cio_server_socket_set_reuse_address
                                  ((cio_server_socket *)
                                   (client_endpoint.impl.sa.unix_address.un.sun_path + 0x66),true);
                if (cVar1 == CIO_SUCCESS) {
                  cVar1 = cio_server_socket_bind
                                    ((cio_server_socket *)
                                     (client_endpoint.impl.sa.unix_address.un.sun_path + 0x66),
                                     (cio_socket_address *)(path + 5));
                  if (cVar1 == CIO_SUCCESS) {
                    cVar1 = cio_server_socket_accept
                                      ((cio_server_socket *)
                                       (client_endpoint.impl.sa.unix_address.un.sun_path + 0x66),
                                       handle_accept,(void *)0x0);
                    if (cVar1 == CIO_SUCCESS) {
                      cVar1 = cio_init_uds_socket_address
                                        ((cio_socket_address *)&socket.impl.field_0x74,&cStack_9d);
                      if (cVar1 == CIO_SUCCESS) {
                        cVar2 = cio_socket_address_get_family
                                          ((cio_socket_address *)&socket.impl.field_0x74);
                        cVar1 = cio_socket_init((cio_socket *)(client.buffer + 0x78),cVar2,&loop,
                                                1000000000,client_socket_close_hook);
                        if (cVar1 == CIO_SUCCESS) {
                          local_3e8 = 0;
                          client.bytes_read = 0;
                          cVar1 = cio_socket_connect((cio_socket *)(client.buffer + 0x78),
                                                     (cio_socket_address *)&socket.impl.field_0x74,
                                                     handle_connect,&local_3e8);
                          if (cVar1 == CIO_SUCCESS) {
                            cVar1 = cio_eventloop_run(&loop);
                            endpoint.impl.sa._105_3_ = 0;
                            endpoint.impl.sa.unix_address.un.sun_path[0x66] = cVar1 != CIO_SUCCESS;
                          }
                          else {
                            fprintf(_stderr,"could not connect to server!\n");
                            endpoint.impl.sa._104_4_ = 1;
                          }
                        }
                        else {
                          fprintf(_stderr,"could not init client socket endpoint!\n");
                          endpoint.impl.sa._104_4_ = 1;
                        }
                      }
                      else {
                        fprintf(_stderr,"could not init client socket endpoint!\n");
                        endpoint.impl.sa._104_4_ = 1;
                      }
                    }
                    else {
                      fprintf(_stderr,"could not run accept on server socket!\n");
                      endpoint.impl.sa._104_4_ = 1;
                    }
                  }
                  else {
                    fprintf(_stderr,"could not bind server socket!\n");
                    endpoint.impl.sa._104_4_ = 1;
                  }
                }
                else {
                  fprintf(_stderr,"could not set reuse_address for server socket!\n");
                  endpoint.impl.sa._104_4_ = 1;
                }
                cio_server_socket_close
                          ((cio_server_socket *)
                           (client_endpoint.impl.sa.unix_address.un.sun_path + 0x66));
              }
              else {
                fprintf(_stderr,"could not init server socket!\n");
                endpoint.impl.sa._104_4_ = 1;
              }
              cio_eventloop_destroy(&loop);
              argv_local._4_4_ = endpoint.impl.sa._104_4_;
            }
            else {
              argv_local._4_4_ = 1;
            }
          }
          else {
            fprintf(_stderr,"could no init server socket endpoint!\n");
            argv_local._4_4_ = -1;
          }
        }
      }
    }
  }
  else {
    usage(*argv);
    argv_local._4_4_ = 1;
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char *argv[])
{
	if (argc != 2) {
		usage(argv[0]);
		return EXIT_FAILURE;
	}

	max_pings = strtoul(argv[1], NULL, BASE_10);
	if (max_pings == ULLONG_MAX) {
		usage(argv[0]);
		return EXIT_FAILURE;
	}

	int ret = EXIT_SUCCESS;
	if (signal(SIGTERM, sighandler) == SIG_ERR) {
		(void)fprintf(stderr, "could no install SIGTERM handler!\n");
		return -1;
	}

	if (signal(SIGINT, sighandler) == SIG_ERR) {
		(void)fprintf(stderr, "could no install SIGINT handler!\n");
		(void)signal(SIGTERM, SIG_DFL);
		return -1;
	}

	struct cio_socket_address endpoint;
	const char path[] = {"\0/tmp/foobar"};
	enum cio_error err = cio_init_uds_socket_address(&endpoint, path);
	if (cio_unlikely(err != CIO_SUCCESS)) {
		(void)fprintf(stderr, "could no init server socket endpoint!\n");
		return -1;
	}

	err = cio_eventloop_init(&loop);
	if (cio_unlikely(err != CIO_SUCCESS)) {
		return EXIT_FAILURE;
	}

	struct cio_server_socket server_socket;
	err = cio_server_socket_init(&server_socket, &loop, SERVERSOCKET_BACKLOG, cio_socket_address_get_family(&endpoint), alloc_echo_client, free_echo_client, CLOSE_TIMEOUT_NS, NULL);
	if (cio_unlikely(err != CIO_SUCCESS)) {
		(void)fprintf(stderr, "could not init server socket!\n");
		ret = EXIT_FAILURE;
		goto destroy_loop;
	}

	err = cio_server_socket_set_reuse_address(&server_socket, true);
	if (cio_unlikely(err != CIO_SUCCESS)) {
		(void)fprintf(stderr, "could not set reuse_address for server socket!\n");
		ret = EXIT_FAILURE;
		goto close_server_socket;
	}

	err = cio_server_socket_bind(&server_socket, &endpoint);
	if (cio_unlikely(err != CIO_SUCCESS)) {
		(void)fprintf(stderr, "could not bind server socket!\n");
		ret = EXIT_FAILURE;
		goto close_server_socket;
	}

	err = cio_server_socket_accept(&server_socket, handle_accept, NULL);
	if (cio_unlikely(err != CIO_SUCCESS)) {
		(void)fprintf(stderr, "could not run accept on server socket!\n");
		ret = EXIT_FAILURE;
		goto close_server_socket;
	}

	struct cio_socket_address client_endpoint;
	err = cio_init_uds_socket_address(&client_endpoint, path);
	if (cio_unlikely(err != CIO_SUCCESS)) {
		(void)fprintf(stderr, "could not init client socket endpoint!\n");
		ret = EXIT_FAILURE;
		goto close_server_socket;
	}

	struct cio_socket socket;
	err = cio_socket_init(&socket, cio_socket_address_get_family(&client_endpoint), &loop, CLOSE_TIMEOUT_NS, client_socket_close_hook);
	if (cio_unlikely(err != CIO_SUCCESS)) {
		(void)fprintf(stderr, "could not init client socket endpoint!\n");
		ret = EXIT_FAILURE;
		goto close_server_socket;
	}

	struct client client;
	client.bytes_read = 0;
	client.number_of_pings = 0;

	err = cio_socket_connect(&socket, &client_endpoint, handle_connect, &client);
	if (err != CIO_SUCCESS) {
		(void)fprintf(stderr, "could not connect to server!\n");
		ret = EXIT_FAILURE;
		goto close_server_socket;
	}

	err = cio_eventloop_run(&loop);
	if (err != CIO_SUCCESS) {
		ret = EXIT_FAILURE;
	}

close_server_socket:
	cio_server_socket_close(&server_socket);
destroy_loop:
	cio_eventloop_destroy(&loop);
	return ret;
}